

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArrayColorDepthAttachmentsTest::TextureCubeMapArrayColorDepthAttachmentsTest
          (TextureCubeMapArrayColorDepthAttachmentsTest *this,Context *context,
          ExtParameters *extParams,char *name,char *description)

{
  _texture_size_vector *this_00;
  _texture_size local_20;
  
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureCubeMapArrayColorDepthAttachmentsTest_01e03cf0;
  this_00 = &this->m_resolutions;
  this->m_vao_id = 0;
  this->m_color_texture_id = 0;
  this->m_depth_texture_id = 0;
  this->m_fragment_shader_id = 0;
  this->m_framebuffer_object_id = 0;
  this->m_layered_geometry_shader_id = 0;
  this->m_layered_program_id = 0;
  this->m_non_layered_geometry_shader_id = 0;
  this->m_non_layered_geometry_shader_id = 0;
  this->m_non_layered_program_id = 0;
  this->m_non_layered_program_id_uni_layer_uniform_location = 0;
  this->m_vertex_shader_id = 0;
  (this->m_resolutions).
  super__Vector_base<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_resolutions).
  super__Vector_base<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_n_invalid_color_checks = 0;
  this->m_n_invalid_depth_checks = 0;
  (this->m_resolutions).
  super__Vector_base<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_depth_internal_format = 0;
  this->m_depth_type = 0;
  local_20.m_size = 8;
  local_20.m_n_cubemaps = 8;
  std::
  vector<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>
  ::emplace_back<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>
            (this_00,&local_20);
  local_20.m_size = 0x40;
  local_20.m_n_cubemaps = 3;
  std::
  vector<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>
  ::emplace_back<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>
            (this_00,&local_20);
  local_20.m_size = 0x75;
  local_20.m_n_cubemaps = 1;
  std::
  vector<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>
  ::emplace_back<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>
            (this_00,&local_20);
  local_20.m_size = 0x100;
  local_20.m_n_cubemaps = 1;
  std::
  vector<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>
  ::emplace_back<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>
            (this_00,&local_20);
  local_20.m_size = 0xad;
  local_20.m_n_cubemaps = 3;
  std::
  vector<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>
  ::emplace_back<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>
            (this_00,&local_20);
  return;
}

Assistant:

TextureCubeMapArrayColorDepthAttachmentsTest::TextureCubeMapArrayColorDepthAttachmentsTest(
	Context& context, const ExtParameters& extParams, const char* name, const char* description)
	: TestCaseBase(context, extParams, name, description)
	, m_vao_id(0)
	, m_color_texture_id(0)
	, m_depth_texture_id(0)
	, m_fragment_shader_id(0)
	, m_framebuffer_object_id(0)
	, m_layered_geometry_shader_id(0)
	, m_layered_program_id(0)
	, m_non_layered_geometry_shader_id(0)
	, m_non_layered_program_id(0)
	, m_non_layered_program_id_uni_layer_uniform_location(0)
	, m_vertex_shader_id(0)
	, m_depth_internal_format(0)
	, m_depth_type(0)
	, m_n_invalid_color_checks(0)
	, m_n_invalid_depth_checks(0)
{
	/* Define tested resolutions */
	m_resolutions.push_back(_texture_size(8, 8));
	m_resolutions.push_back(_texture_size(64, 3));
	m_resolutions.push_back(_texture_size(117, 1));
	m_resolutions.push_back(_texture_size(256, 1));
	m_resolutions.push_back(_texture_size(173, 3));
}